

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

SettingsValue * __thiscall ArgsManager::GetSetting(ArgsManager *this,string *arg)

{
  long lVar1;
  ArgsManager *this_00;
  string *arg_00;
  char *in_RSI;
  SettingsValue *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff5c;
  string *in_stack_ffffffffffffff60;
  SettingsValue *pszFile;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  Settings *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RSI,(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  arg_00 = (string *)(in_RSI + 0x28);
  this_00 = (ArgsManager *)(in_RSI + 0x100);
  SettingName(in_stack_ffffffffffffff60);
  UseDefaultSection(this_00,arg_00);
  uVar2 = 0;
  common::GetSetting(in_stack_ffffffffffffffa0,(string *)this_00,arg_00,
                     (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde,
                     (bool)in_stack_ffffffffffffffdd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,uVar2));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,uVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pszFile;
  }
  __stack_chk_fail();
}

Assistant:

common::SettingsValue ArgsManager::GetSetting(const std::string& arg) const
{
    LOCK(cs_args);
    return common::GetSetting(
        m_settings, m_network, SettingName(arg), !UseDefaultSection(arg),
        /*ignore_nonpersistent=*/false, /*get_chain_type=*/false);
}